

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Tile * createTile(Image *image,int x,int y,int w,int h,
                 vector<Tile_*,_std::allocator<Tile_*>_> *tiles,bool mirrored)

{
  Tile *this;
  reference pvVar1;
  Tile *pTVar2;
  Tile *pTVar3;
  Tile *flipped;
  uchar *puStack_58;
  int i;
  uchar *tile_ptr;
  uchar *ptr;
  Tile *tile;
  bool mirrored_local;
  vector<Tile_*,_std::allocator<Tile_*>_> *tiles_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Image *image_local;
  
  this = (Tile *)operator_new(0x50);
  Tile::Tile(this,0,false,false,false,(Tile *)0x0);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&image->pixels,0);
  tile_ptr = pvVar1 + (long)x + (ulong)(y * image->width);
  puStack_58 = this->data;
  for (flipped._4_4_ = 0; flipped._4_4_ < h; flipped._4_4_ = flipped._4_4_ + 1) {
    memcpy(puStack_58,tile_ptr,(long)w);
    puStack_58 = puStack_58 + w;
    tile_ptr = tile_ptr + image->width;
  }
  pTVar2 = find_duplicate(this,tiles);
  this->original_tile = pTVar2;
  if (this->original_tile != (Tile *)0x0) {
    this->is_duplicate = true;
  }
  if ((mirrored) && ((this->is_duplicate & 1U) == 0)) {
    pTVar2 = Tile::flipX(this);
    pTVar3 = find_duplicate(pTVar2,tiles);
    this->original_tile = pTVar3;
    if (pTVar2 != (Tile *)0x0) {
      operator_delete(pTVar2);
    }
    if (this->original_tile == (Tile *)0x0) {
      pTVar2 = Tile::flipY(this);
      pTVar3 = find_duplicate(pTVar2,tiles);
      this->original_tile = pTVar3;
      if (pTVar2 != (Tile *)0x0) {
        operator_delete(pTVar2);
      }
      if (this->original_tile == (Tile *)0x0) {
        pTVar2 = Tile::flipXY(this);
        pTVar3 = find_duplicate(pTVar2,tiles);
        this->original_tile = pTVar3;
        if (pTVar2 != (Tile *)0x0) {
          operator_delete(pTVar2);
        }
        if (this->original_tile != (Tile *)0x0) {
          this->flipped_x = true;
          this->flipped_y = true;
          this->is_duplicate = true;
        }
      }
      else {
        this->flipped_y = true;
        this->is_duplicate = true;
      }
    }
    else {
      this->flipped_x = true;
      this->is_duplicate = true;
    }
  }
  return this;
}

Assistant:

Tile *createTile(Image *image, int x, int y, int w, int h, std::vector<Tile *> *tiles, bool mirrored) {
    Tile *tile = new Tile(0, false, false, false, nullptr);

    unsigned char *ptr = &image->pixels[0] + y * image->width + x;
    unsigned char *tile_ptr = tile->data;
    for (int i = 0; i < h; i++) {
        memcpy(tile_ptr, ptr, w);
        tile_ptr += w;
        ptr += image->width;
    }

    tile->original_tile = find_duplicate(tile, tiles);
    if (tile->original_tile) {
        tile->is_duplicate = true;
    }

    if (mirrored && !tile->is_duplicate) {
        Tile *flipped = tile->flipX();
        tile->original_tile = find_duplicate(flipped, tiles);
        delete flipped;
        if (tile->original_tile) {
            tile->flipped_x = true;
            tile->is_duplicate = true;
        } else {
            flipped = tile->flipY();
            tile->original_tile = find_duplicate(flipped, tiles);
            delete flipped;
            if (tile->original_tile) {
                tile->flipped_y = true;
                tile->is_duplicate = true;
            } else {
                flipped = tile->flipXY();
                tile->original_tile = find_duplicate(flipped, tiles);
                delete flipped;
                if (tile->original_tile) {
                    tile->flipped_x = true;
                    tile->flipped_y = true;
                    tile->is_duplicate = true;
                }
            }
        }
    }

    return tile;
}